

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void OpenBreakpointsFile(path *filename,EBreakpointsFile type)

{
  ulong uVar1;
  char *pcVar2;
  string local_68;
  string local_38;
  EBreakpointsFile local_14;
  path *ppStack_10;
  EBreakpointsFile type_local;
  path *filename_local;
  
  local_14 = type;
  ppStack_10 = filename;
  uVar1 = std::filesystem::__cxx11::path::has_filename();
  if ((uVar1 & 1) == 0) {
    std::filesystem::__cxx11::path::string(&local_38,ppStack_10);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Error("empty filename",pcVar2,EARLY);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (FP_BreakpointsFile == (FILE *)0x0) {
    FP_BreakpointsFile = SJ_fopen(ppStack_10,"w");
    if (FP_BreakpointsFile == (FILE *)0x0) {
      std::filesystem::__cxx11::path::string(&local_68,ppStack_10);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Error("opening file for write",pcVar2,EARLY);
      std::__cxx11::string::~string((string *)&local_68);
    }
    breakpointsCounter = 0;
    breakpointsType = local_14;
  }
  else {
    Error("breakpoints file was already opened",(char *)0x0,EARLY);
  }
  return;
}

Assistant:

void OpenBreakpointsFile(const std::filesystem::path & filename, const EBreakpointsFile type) {
	if (!filename.has_filename()) {
		Error("empty filename", filename.string().c_str(), EARLY);
		return;
	}
	if (FP_BreakpointsFile) {
		Error("breakpoints file was already opened", nullptr, EARLY);
		return;
	}
	if (!FOPEN_ISOK(FP_BreakpointsFile, filename, "w")) {
		Error("opening file for write", filename.string().c_str(), EARLY);
	}
	breakpointsCounter = 0;
	breakpointsType = type;
}